

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

void remove_always_return_values(ListNode *map_head,size_t number_of_symbol_names)

{
  ListNode *head;
  void *result;
  ListNode *pLVar1;
  int iVar2;
  ListNode *node;
  
  _assert_true((unsigned_long)map_head,"map_head",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x35f);
  _assert_true(number_of_symbol_names,"number_of_symbol_names",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x360);
  pLVar1 = map_head->next;
  while (node = pLVar1, node != map_head) {
    result = node->value;
    pLVar1 = node->next;
    _assert_true((unsigned_long)result,"value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
                 ,0x366);
    head = (ListNode *)((long)result + 8);
    iVar2 = list_empty(head);
    if (iVar2 == 0) {
      if (number_of_symbol_names == 1) {
        if ((*(ListNode **)((long)result + 0x18))->refcount < -1) {
          list_remove_free(*(ListNode **)((long)result + 0x18),free_value,(void *)0x0);
        }
      }
      else {
        remove_always_return_values(head,1);
      }
    }
    iVar2 = list_empty(head);
    if (iVar2 != 0) {
      list_remove_free(node,free_value,(void *)0x0);
    }
  }
  return;
}

Assistant:

static void remove_always_return_values(ListNode * const map_head,
                                        const size_t number_of_symbol_names) {
    ListNode *current;
    assert_non_null(map_head);
    assert_true(number_of_symbol_names);
    current = map_head->next;
    while (current != map_head) {
        SymbolMapValue * const value = (SymbolMapValue*)current->value;
        ListNode * const next = current->next;
        ListNode *child_list;
        assert_non_null(value);
        child_list = &value->symbol_values_list_head;

        if (!list_empty(child_list)) {
            if (number_of_symbol_names == 1) {
                ListNode * const child_node = child_list->next;
                /* If this item has been returned more than once, free it. */
                if (child_node->refcount < -1) {
                    list_remove_free(child_node, free_value, NULL);
                }
            } else {
                remove_always_return_values(child_list,
                                            number_of_symbol_names - 1);
            }
        }

        if (list_empty(child_list)) {
            list_remove_free(current, free_value, NULL);
        }
        current = next;
    }
}